

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DestroyContext(ImGuiContext *ctx)

{
  ImGuiContext *in_RDI;
  ImGuiContext *in_stack_00000010;
  undefined8 local_8;
  
  local_8 = in_RDI;
  if (in_RDI == (ImGuiContext *)0x0) {
    local_8 = GImGui;
  }
  Shutdown(in_stack_00000010);
  if (GImGui == local_8) {
    SetCurrentContext((ImGuiContext *)0x0);
  }
  IM_DELETE<ImGuiContext>((ImGuiContext *)0x12a285);
  return;
}

Assistant:

void ImGui::DestroyContext(ImGuiContext* ctx)
{
    if (ctx == NULL)
        ctx = GImGui;
    Shutdown(ctx);
    if (GImGui == ctx)
        SetCurrentContext(NULL);
    IM_DELETE(ctx);
}